

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCtxFormat::emulate_mthd(MthdCtxFormat *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t local_18;
  int fmt;
  int sfmt;
  MthdCtxFormat *this_local;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val & 3;
  local_18 = 0;
  if (uVar1 == 1) {
    if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x44) ||
       ((this->super_SingleMthdTest).super_MthdTest.cls == 0x57)) {
      local_18 = 0xb;
    }
    else {
      local_18 = 2;
    }
  }
  if (uVar1 == 2) {
    local_18 = 8;
  }
  if (uVar1 == 3) {
    local_18 = 0xd;
  }
  pgraph_grobj_set_color_format
            (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
             (this->super_SingleMthdTest).super_MthdTest.egrobj,local_18);
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x57) ||
     (((this->super_SingleMthdTest).super_MthdTest.cls == 0x17 &&
      (0x3f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
              super_Test.chipset.card_type)))) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar1 & 0xffffff | uVar2 << 0x18;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x57) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xfffdffff |
         (uint)(-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                   nsource << 0x3e)) << 0x11;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x44) ||
     (((this->super_SingleMthdTest).super_MthdTest.cls == 0x18 &&
      (0x3f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
              super_Test.chipset.card_type)))) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar1 & 0xffff00ff | (uVar2 & 0xff) << 8;
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar1 & 0xff00ffff | (uVar2 & 0xff) << 0x10;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x44) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid & 0xffefffff |
         (uint)(-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                   nsource << 0x3e)) << 0x14;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		int sfmt = val & 3;
		int fmt = 0;
		if (sfmt == 1) {
			if (cls == 0x44 || cls == 0x57)
				fmt = 0xb;
			else
				fmt = 0x2;
		}
		if (sfmt == 2)
			fmt = 0x8;
		if (sfmt == 3)
			fmt = 0xd;
		pgraph_grobj_set_color_format(&exp, egrobj, fmt);
		if (cls == 0x57 || (cls == 0x17 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 24, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x57) {
			insrt(exp.ctx_valid, 17, 1, !extr(exp.nsource, 1, 1));
		}
		if (cls == 0x44 || (cls == 0x18 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 8, 8, pgraph_grobj_get_color_format(&exp));
			insrt(exp.ctx_format, 16, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x44) {
			insrt(exp.ctx_valid, 20, 1, !extr(exp.nsource, 1, 1));
		}
	}